

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O1

Resource * __thiscall
Diligent::ShaderResourceCacheVk::DescriptorSet::GetResource(DescriptorSet *this,Uint32 CacheOffset)

{
  char (*in_R8) [17];
  string msg;
  Uint32 local_34;
  string local_30;
  
  local_34 = CacheOffset;
  if (this->m_NumResources <= CacheOffset) {
    FormatString<char[8],unsigned_int,char[17]>
              (&local_30,(Diligent *)"Offset ",(char (*) [8])&local_34,(uint *)0x80e7d7,in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xa1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_pResources + local_34;
}

Assistant:

const Resource& GetResource(Uint32 CacheOffset) const
        {
            VERIFY(CacheOffset < m_NumResources, "Offset ", CacheOffset, " is out of range");
            return m_pResources[CacheOffset];
        }